

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap32::RescanPage
          (HeapBlockMap32 *this,void *dirtyPage,bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  HeapBlockType blockType;
  L2MapChunk *chunk;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint id2;
  ulong uVar4;
  
  chunk = this->map[(ulong)dirtyPage >> 0x14 & 0xfff];
  if (chunk == (L2MapChunk *)0x0) goto switchD_0062c76f_caseD_0;
  uVar4 = (ulong)dirtyPage >> 0xc & 0xff;
  blockType = chunk->blockInfo[uVar4].blockType;
  id2 = (uint)uVar4;
  switch(blockType) {
  case LargeBlockTypeCount:
  case SmallNormalBlockWithBarrierType:
    bVar2 = RescanHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                      (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2b7,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  case FreeBlockType:
switchD_0062c76f_caseD_0:
    bVar2 = false;
    break;
  case SmallFinalizableBlockType:
  case MediumAllocBlockTypeCount:
    bVar2 = RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                      (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
    break;
  case MediumNormalBlockType:
  case MediumNormalBlockWithBarrierType:
    bVar2 = RescanHeapBlock<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                      (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
    break;
  case MediumFinalizableBlockType:
  case MediumFinalizableBlockWithBarrierType:
    bVar2 = RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                      (this,dirtyPage,blockType,chunk,id2,anyObjectsMarkedOnPage,recycler);
  }
  return bVar2;
}

Assistant:

bool
HeapBlockMap32::RescanPage(void * dirtyPage, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    uint id1 = GetLevel1Id(dirtyPage);
    L2MapChunk * chunk = map[id1];
    if (chunk != nullptr)
    {
        uint id2 = GetLevel2Id(dirtyPage);
        HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;
        // Determine block type and process as appropriate
        switch (blockType)
        {
        case HeapBlock::HeapBlockType::FreeBlockType:
            // We had a false reference to a free block.  Do nothing.
            break;

        case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<SmallFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
            return RescanHeapBlock<SmallRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumNormalHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
        case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
        case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
            return RescanHeapBlock<MediumFinalizableHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#ifdef RECYCLER_VISITED_HOST
        case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
            return RescanHeapBlock<MediumRecyclerVisitedHostHeapBlock>(dirtyPage, blockType, chunk, id2, anyObjectsMarkedOnPage, recycler);
#endif
        default:
            // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
            Assert(false);
            break;
        }
    }

    return false;
}